

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::CacheState::perform
          (CacheState *this,VkPipelineStageFlagBits stage,VkAccessFlagBits access)

{
  VkAccessFlags *pVVar1;
  VkPipelineStageFlagBits VVar2;
  uint uVar3;
  PipelineStage PVar4;
  PipelineStage PVar5;
  VkPipelineStageFlags dstStage_;
  VkPipelineStageFlagBits flags;
  
  PVar4 = pipelineStageFlagToPipelineStage(stage);
  VVar2 = this->m_allowedStages;
  uVar3 = this->m_allowedAccesses;
  for (flags = VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT; flags <= VVar2; flags = flags * 2) {
    if ((VVar2 & flags) != 0) {
      PVar5 = pipelineStageFlagToPipelineStage(flags);
      this->m_incompleteOperations[PVar5] = this->m_incompleteOperations[PVar5] | stage;
      if ((access & (VK_ACCESS_MEMORY_WRITE_BIT|VK_ACCESS_HOST_WRITE_BIT|
                     VK_ACCESS_TRANSFER_WRITE_BIT|VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT|
                     VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT|VK_ACCESS_SHADER_WRITE_BIT)) != 0) {
        this->m_invisibleOperations[PVar5] = this->m_invisibleOperations[PVar5] | uVar3;
        pVVar1 = this->m_unavailableWriteOperations[PVar5] + PVar4;
        *pVVar1 = *pVVar1 | access;
      }
    }
  }
  return;
}

Assistant:

void CacheState::perform (vk::VkPipelineStageFlagBits	stage,
						  vk::VkAccessFlagBits			access)
{
	DE_ASSERT((access & (~m_allowedAccesses)) == 0);
	DE_ASSERT((stage & (~m_allowedStages)) == 0);

	const PipelineStage srcStage = pipelineStageFlagToPipelineStage(stage);

	for (vk::VkPipelineStageFlags dstStage_ = 1; dstStage_ <= m_allowedStages; dstStage_ <<= 1)
	{
		const PipelineStage dstStage = pipelineStageFlagToPipelineStage((vk::VkPipelineStageFlagBits)dstStage_);

		if ((dstStage_ & m_allowedStages) == 0)
			continue;

		// Mark stage as incomplete for all stages
		m_incompleteOperations[dstStage] |= stage;

		if (isWriteAccess(access))
		{
			// Mark all accesses from all stages invisible
			m_invisibleOperations[dstStage] |= m_allowedAccesses;

			// Mark write access from srcStage unavailable to all stages
			m_unavailableWriteOperations[dstStage][srcStage] |= access;
		}
	}
}